

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O0

void test_value_decimal128(void)

{
  byte bVar1;
  uint uVar2;
  undefined8 uVar3;
  bson_decimal128_t *pbVar4;
  undefined8 uVar5;
  bson_t *doc;
  bson_t other;
  bson_decimal128_t dec;
  bson_iter_t iter;
  bson_value_t copy;
  bson_value_t *value;
  byte local_291;
  undefined4 local_280;
  undefined4 local_27c;
  undefined1 local_278;
  bson_decimal128_t local_190;
  undefined1 local_180 [200];
  undefined1 local_b8 [32];
  long local_98;
  
  memset(&local_280,0,0x80);
  local_280 = 3;
  local_27c = 5;
  local_278 = 5;
  bVar1 = bson_decimal128_from_string("123.5",&local_190);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c"
            ,0x75,"test_value_decimal128","bson_decimal128_from_string (\"123.5\", &dec)");
    abort();
  }
  uVar3 = bson_bcon_magic();
  pbVar4 = bcon_ensure_const_decimal128_ptr(&local_190);
  uVar3 = bcon_new(0,"decimal128",uVar3,0x12,pbVar4);
  uVar2 = bson_iter_init(local_180,uVar3);
  local_291 = 0;
  if ((uVar2 & 1) != 0) {
    local_291 = bson_iter_next(local_180);
  }
  if ((local_291 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c"
            ,0x77,"test_value_decimal128","bson_iter_init (&iter, doc) && bson_iter_next (&iter)");
    abort();
  }
  local_98 = bson_iter_value(local_180);
  if (local_98 == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c"
            ,0x78,"test_value_decimal128","(value = bson_iter_value (&iter))");
    abort();
  }
  bson_value_copy(local_98,local_b8);
  uVar5 = bson_iter_key(local_180);
  bVar1 = bson_append_value(&local_280,uVar5,0xffffffff,local_b8);
  if ((bVar1 & 1) != 0) {
    bson_value_destroy(local_b8);
    bson_destroy(uVar3);
    bson_destroy(&local_280);
    return;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-value.c",
          0x7a,"test_value_decimal128",
          "bson_append_value (&other, bson_iter_key (&iter), -1, &copy)");
  abort();
}

Assistant:

static void
test_value_decimal128 (void)
{
   const bson_value_t *value;
   bson_value_t copy;
   bson_iter_t iter;
   bson_decimal128_t dec;
   bson_t other = BSON_INITIALIZER;
   bson_t *doc;

   BSON_ASSERT (bson_decimal128_from_string ("123.5", &dec));
   doc = BCON_NEW ("decimal128", BCON_DECIMAL128 (&dec));
   BSON_ASSERT (bson_iter_init (&iter, doc) && bson_iter_next (&iter));
   BSON_ASSERT ((value = bson_iter_value (&iter)));
   bson_value_copy (value, &copy);
   BSON_ASSERT (bson_append_value (&other, bson_iter_key (&iter), -1, &copy));

   bson_value_destroy (&copy);
   bson_destroy (doc);
   bson_destroy (&other);
}